

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O3

void __thiscall fasttext::Args::load(Args *this,istream *in)

{
  std::istream::read((char *)in,(long)&this->dim);
  std::istream::read((char *)in,(long)&this->ws);
  std::istream::read((char *)in,(long)&this->epoch);
  std::istream::read((char *)in,(long)&this->minCount);
  std::istream::read((char *)in,(long)&this->neg);
  std::istream::read((char *)in,(long)&this->wordNgrams);
  std::istream::read((char *)in,(long)&this->loss);
  std::istream::read((char *)in,(long)&this->model);
  std::istream::read((char *)in,(long)&this->bucket);
  std::istream::read((char *)in,(long)&this->minn);
  std::istream::read((char *)in,(long)&this->maxn);
  std::istream::read((char *)in,(long)&this->lrUpdateRate);
  std::istream::read((char *)in,(long)&this->addWo);
  std::istream::read((char *)in,(long)&this->factor);
  std::istream::read((char *)in,(long)&this->t);
  return;
}

Assistant:

void Args::load(std::istream& in) {
  in.read((char*)&(dim), sizeof(int));
  in.read((char*)&(ws), sizeof(int));
  in.read((char*)&(epoch), sizeof(int));
  in.read((char*)&(minCount), sizeof(int));
  in.read((char*)&(neg), sizeof(int));
  in.read((char*)&(wordNgrams), sizeof(int));
  in.read((char*)&(loss), sizeof(loss_name));
  in.read((char*)&(model), sizeof(model_name));
  in.read((char*)&(bucket), sizeof(int));
  in.read((char*)&(minn), sizeof(int));
  in.read((char*)&(maxn), sizeof(int));
  in.read((char*)&(lrUpdateRate), sizeof(int));
  in.read((char*)&(addWo), sizeof(double));
  in.read((char*)&(factor), sizeof(int));
  in.read((char*)&(t), sizeof(double));
}